

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  byte *pbVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  stbi_uc sVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  float *output;
  stbi_uc *psVar10;
  stbi_uc *psVar11;
  long lVar12;
  stbi_uc sVar13;
  int c;
  float *output_00;
  int *piVar14;
  uint uVar15;
  int iVar16;
  int b;
  stbi_uc sVar17;
  byte bVar18;
  uint a;
  ulong uVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  stbi_uc rgbe [4];
  stbi_uc rgbe_1 [4];
  char buffer [1024];
  stbi_uc *local_4a8;
  float *local_498;
  stbi_uc *local_490;
  long local_488;
  int *local_448;
  stbi_uc local_440;
  stbi_uc local_43f;
  stbi_uc local_43e;
  stbi_uc local_43d;
  stbi_uc local_43c [4];
  char local_438;
  undefined1 uStack_437;
  char cStack_436;
  int iStack_435;
  undefined4 uStack_431;
  undefined5 uStack_42d;
  undefined7 uStack_428;
  
  uVar8 = (ulong)(uint)req_comp;
  stbi__hdr_gettoken(s,&local_438);
  if ((CONCAT44(uStack_431,iStack_435) == 0x45434e41494441 &&
       CONCAT17((undefined1)uStack_431,
                CONCAT43(iStack_435,CONCAT12(cStack_436,CONCAT11(uStack_437,local_438)))) ==
       0x4e41494441523f23) ||
     (iStack_435 == 0x454247 &&
      CONCAT13((undefined1)iStack_435,CONCAT12(cStack_436,CONCAT11(uStack_437,local_438))) ==
      0x47523f23)) {
    stbi__hdr_gettoken(s,&local_438);
    if (local_438 != '\0') {
      bVar5 = false;
      do {
        auVar21[1] = uStack_437;
        auVar21[0] = local_438;
        auVar21[2] = cStack_436;
        auVar21._3_4_ = iStack_435;
        auVar21._7_4_ = uStack_431;
        auVar21._11_5_ = uStack_42d;
        auVar4._4_5_ = uStack_42d;
        auVar4._0_4_ = uStack_431;
        auVar4._9_7_ = uStack_428;
        auVar21 = vpternlogq_avx512vl(s_FORMAT_32_bit_rl32_bit_rle_rgbe_005721a0._0_16_ ^ auVar21,
                                      s_FORMAT_32_bit_rl32_bit_rle_rgbe_005721a0._16_16_,auVar4,0xf6
                                     );
        if (auVar21 == (undefined1  [16])0x0) {
          bVar5 = true;
        }
        stbi__hdr_gettoken(s,&local_438);
        iVar16 = (int)uVar8;
      } while (local_438 != '\0');
      if (bVar5) {
        stbi__hdr_gettoken(s,&local_438);
        if (cStack_436 == ' ' && CONCAT11(uStack_437,local_438) == 0x592d) {
          local_448 = &iStack_435;
          uVar8 = strtol((char *)local_448,(char **)&local_448,10);
          local_448 = (int *)((long)local_448 + 2);
          do {
            piVar14 = local_448;
            local_448 = (int *)((long)piVar14 + 1);
          } while (*(char *)((long)piVar14 + -2) == ' ');
          if (((*(char *)((long)piVar14 + -2) == '+') && (*(char *)((long)piVar14 + -1) == 'X')) &&
             ((char)*piVar14 == ' ')) {
            uVar9 = strtol((char *)local_448,(char **)0x0,10);
            a = (uint)uVar9;
            *x = a;
            b = (int)uVar8;
            *y = b;
            if (comp != (int *)0x0) {
              *comp = 3;
            }
            c = 3;
            if (req_comp != 0) {
              c = req_comp;
            }
            iVar7 = stbi__mad4sizes_valid(a,b,c,(int)x,iVar16);
            if (iVar7 == 0) {
              stbi__g_failure_reason = "too large";
              return (float *)0x0;
            }
            output = (float *)stbi__malloc_mad4(a,b,c,(int)x,iVar16);
            if (output != (float *)0x0) {
              iVar16 = 0;
              if (a - 0x8000 < 0xffff8008) goto LAB_003210c7;
              if (b < 1) {
                return output;
              }
              psVar1 = s->buffer_start + 1;
              psVar2 = s->buffer_start;
              local_4a8 = (stbi_uc *)0x0;
              uVar20 = 0;
              local_498 = output;
              while( true ) {
                psVar11 = s->img_buffer;
                psVar10 = s->img_buffer_end;
                if (psVar11 < psVar10) {
                  s->img_buffer = psVar11 + 1;
                  sVar6 = *psVar11;
                  psVar11 = psVar11 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar6 = '\0';
                }
                else {
                  iVar16 = (*(s->io).read)(s->io_user_data,(char *)psVar2,s->buflen);
                  if (iVar16 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar6 = '\0';
                    psVar10 = psVar1;
                  }
                  else {
                    sVar6 = *psVar2;
                    psVar10 = psVar2 + iVar16;
                  }
                  s->img_buffer_end = psVar10;
                  s->img_buffer = psVar1;
                  psVar11 = psVar1;
                }
                if (psVar11 < psVar10) {
                  s->img_buffer = psVar11 + 1;
                  sVar13 = *psVar11;
                  psVar11 = psVar11 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar13 = '\0';
                }
                else {
                  iVar16 = (*(s->io).read)(s->io_user_data,(char *)psVar2,s->buflen);
                  if (iVar16 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar13 = '\0';
                    psVar10 = psVar1;
                  }
                  else {
                    sVar13 = *psVar2;
                    psVar10 = psVar2 + iVar16;
                  }
                  s->img_buffer_end = psVar10;
                  s->img_buffer = psVar1;
                  psVar11 = psVar1;
                }
                if (psVar11 < psVar10) {
                  s->img_buffer = psVar11 + 1;
                  sVar17 = *psVar11;
                  psVar11 = psVar11 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar17 = '\0';
                }
                else {
                  iVar16 = (*(s->io).read)(s->io_user_data,(char *)psVar2,s->buflen);
                  if (iVar16 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar17 = '\0';
                    psVar10 = psVar1;
                  }
                  else {
                    sVar17 = *psVar2;
                    psVar10 = psVar2 + iVar16;
                  }
                  s->img_buffer_end = psVar10;
                  s->img_buffer = psVar1;
                  psVar11 = psVar1;
                }
                if (((sVar6 != '\x02') || (sVar13 != '\x02')) || ((char)sVar17 < '\0')) {
                  local_440 = sVar6;
                  local_43f = sVar13;
                  local_43e = sVar17;
                  local_43d = stbi__get8(s);
                  stbi__hdr_convert(output,&local_440,c);
                  free(local_4a8);
                  iVar16 = 0;
                  iVar7 = 1;
                  do {
                    stbi__getn(s,local_43c,4);
                    stbi__hdr_convert(output + (long)(int)(c * a * iVar16) + (long)(iVar7 * c),
                                      local_43c,c);
                    iVar7 = iVar7 + 1;
                    while ((int)a <= iVar7) {
                      iVar16 = iVar16 + 1;
LAB_003210c7:
                      iVar7 = 0;
                      if (b <= iVar16) {
                        return output;
                      }
                    }
                  } while( true );
                }
                if (psVar11 < psVar10) {
                  s->img_buffer = psVar11 + 1;
                  sVar6 = *psVar11;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar6 = '\0';
                }
                else {
                  iVar16 = (*(s->io).read)(s->io_user_data,(char *)psVar2,s->buflen);
                  if (iVar16 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar6 = '\0';
                    psVar11 = psVar1;
                  }
                  else {
                    sVar6 = *psVar2;
                    psVar11 = psVar2 + iVar16;
                  }
                  s->img_buffer_end = psVar11;
                  s->img_buffer = psVar1;
                }
                if (CONCAT11(sVar17,sVar6) != a) {
                  free(output);
                  free(local_4a8);
                  stbi__g_failure_reason = "invalid decoded scanline length";
                  return (float *)0x0;
                }
                if ((local_4a8 == (stbi_uc *)0x0) &&
                   (local_4a8 = (stbi_uc *)malloc((ulong)(a * 4)), local_4a8 == (stbi_uc *)0x0))
                break;
                local_488 = 0;
                local_490 = local_4a8;
                do {
                  iVar16 = 0;
                  uVar19 = uVar9 & 0xffffffff;
                  do {
                    pbVar3 = s->img_buffer;
                    psVar11 = s->img_buffer_end;
                    if (pbVar3 < psVar11) {
                      s->img_buffer = pbVar3 + 1;
                      bVar18 = *pbVar3;
                      psVar10 = pbVar3 + 1;
LAB_00320e0a:
                      if (bVar18 < 0x81) {
                        uVar15 = (uint)bVar18;
                        if ((uint)uVar19 < uVar15) goto LAB_00321030;
                        if (uVar15 != 0) {
                          lVar12 = 0;
                          do {
                            psVar11 = s->img_buffer;
                            if (psVar11 < s->img_buffer_end) {
                              s->img_buffer = psVar11 + 1;
                              sVar6 = *psVar11;
                            }
                            else if (s->read_from_callbacks == 0) {
                              sVar6 = '\0';
                            }
                            else {
                              iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar2,s->buflen);
                              if (iVar7 == 0) {
                                s->read_from_callbacks = 0;
                                s->buffer_start[0] = '\0';
                                sVar6 = '\0';
                                psVar11 = psVar1;
                              }
                              else {
                                sVar6 = *psVar2;
                                psVar11 = psVar2 + iVar7;
                              }
                              s->img_buffer_end = psVar11;
                              s->img_buffer = psVar1;
                            }
                            local_490[lVar12 * 4 + (long)iVar16 * 4] = sVar6;
                            lVar12 = lVar12 + 1;
                          } while (uVar15 != (uint)lVar12);
                          iVar16 = iVar16 + (uint)lVar12;
                        }
                      }
                      else {
                        if (psVar10 < psVar11) {
                          s->img_buffer = psVar10 + 1;
                          sVar6 = *psVar10;
                        }
                        else if (s->read_from_callbacks == 0) {
                          sVar6 = '\0';
                        }
                        else {
                          iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar2,s->buflen);
                          if (iVar7 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            sVar6 = '\0';
                            psVar11 = psVar1;
                          }
                          else {
                            sVar6 = *psVar2;
                            psVar11 = psVar2 + iVar7;
                          }
                          s->img_buffer_end = psVar11;
                          s->img_buffer = psVar1;
                        }
                        if ((uint)uVar19 < (bVar18 & 0x7f)) {
LAB_00321030:
                          free(output);
                          free(local_4a8);
                          stbi__g_failure_reason = "corrupt";
                          return (float *)0x0;
                        }
                        if ((bVar18 & 0x7f) != 0) {
                          lVar12 = 0;
                          do {
                            local_490[lVar12 * 4 + (long)iVar16 * 4] = sVar6;
                            lVar12 = lVar12 + 1;
                          } while ((bVar18 & 0x7f) != (uint)lVar12);
                          iVar16 = iVar16 + (uint)lVar12;
                        }
                      }
                    }
                    else if (s->read_from_callbacks != 0) {
                      iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar2,s->buflen);
                      if (iVar7 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        bVar18 = 0;
                        psVar11 = psVar1;
                      }
                      else {
                        bVar18 = *psVar2;
                        psVar11 = psVar2 + iVar7;
                      }
                      s->img_buffer_end = psVar11;
                      s->img_buffer = psVar1;
                      psVar10 = psVar1;
                      goto LAB_00320e0a;
                    }
                    uVar19 = (ulong)(a - iVar16);
                  } while (a - iVar16 != 0 && iVar16 <= (int)a);
                  local_490 = local_490 + 1;
                  local_488 = local_488 + 1;
                  output_00 = local_498;
                  psVar11 = local_4a8;
                  uVar19 = uVar9 & 0x7fffffff;
                } while (local_488 != 4);
                do {
                  stbi__hdr_convert(output_00,psVar11,c);
                  uVar19 = uVar19 - 1;
                  output_00 = output_00 + c;
                  psVar11 = psVar11 + 4;
                } while (uVar19 != 0);
                local_498 = local_498 + (uVar9 & 0xffffffff) * (long)c;
                uVar20 = uVar20 + 1;
                if (uVar20 == (uVar8 & 0x7fffffff)) {
                  free(local_4a8);
                  return output;
                }
              }
              free(output);
            }
            stbi__g_failure_reason = "outofmem";
            return (float *)0x0;
          }
        }
        stbi__g_failure_reason = "unsupported data layout";
        return (float *)0x0;
      }
    }
    stbi__g_failure_reason = "unsupported format";
  }
  else {
    stbi__g_failure_reason = "not HDR";
  }
  return (float *)0x0;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;
   const char *headerToken;
   STBI_NOTUSED(ri);

   // Check identifier
   headerToken = stbi__hdr_gettoken(s,buffer);
   if (strcmp(headerToken, "#?RADIANCE") != 0 && strcmp(headerToken, "#?RGBE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   if (!stbi__mad4sizes_valid(width, height, req_comp, sizeof(float), 0))
      return stbi__errpf("too large", "HDR image is too large");

   // Read data
   hdr_data = (float *) stbi__malloc_mad4(width, height, req_comp, sizeof(float), 0);
   if (!hdr_data)
      return stbi__errpf("outofmem", "Out of memory");

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) {
            scanline = (stbi_uc *) stbi__malloc_mad2(width, 4, 0);
            if (!scanline) {
               STBI_FREE(hdr_data);
               return stbi__errpf("outofmem", "Out of memory");
            }
         }

         for (k = 0; k < 4; ++k) {
            int nleft;
            i = 0;
            while ((nleft = width - i) > 0) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      if (scanline)
         STBI_FREE(scanline);
   }

   return hdr_data;
}